

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.hpp
# Opt level: O0

data_ptr_t duckdb::ARTKey::CreateData<long>(ArenaAllocator *allocator,long value)

{
  data_ptr_t value_00;
  data_ptr_t in_RSI;
  data_ptr_t data;
  
  value_00 = ArenaAllocator::Allocate(allocator,value);
  Radix::EncodeData<long>(in_RSI,(int64_t)value_00);
  return value_00;
}

Assistant:

static inline data_ptr_t CreateData(ArenaAllocator &allocator, T value) {
		auto data = allocator.Allocate(sizeof(value));
		Radix::EncodeData<T>(data, value);
		return data;
	}